

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRandom.cpp
# Opt level: O0

Index __thiscall AgentRandom::Act(AgentRandom *this)

{
  unsigned_long uVar1;
  uint uVar2;
  int iVar3;
  Index IVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  Index aI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrAis;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  undefined1 auVar8 [64];
  undefined1 auVar6 [16];
  
  __x = in_RDI;
  AgentDecPOMDPDiscrete::GetPU
            ((AgentDecPOMDPDiscrete *)
             ((long)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start +
             (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[-3]));
  PlanningUnitMADPDiscrete::GetNrActions((PlanningUnitMADPDiscrete *)0x8fc36a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(unaff_retaddr,__x);
  uVar1 = (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[-3];
  uVar2 = (**(code **)(*(long *)((long)&(in_RDI->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar1) + 0x10))
                    ((long)&(in_RDI->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + uVar1);
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM0_Qa;
  auVar6 = auVar8._0_16_;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&local_20,(ulong)uVar2);
  auVar6 = vcvtusi2sd_avx512f(auVar6,*pvVar5);
  iVar3 = rand();
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar6._0_8_ * (double)iVar3 * 4.656612873077393e-10;
  IVar4 = vcvttsd2usi_avx512f(auVar7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
  return IVar4;
}

Assistant:

Index AgentRandom::Act()
{
    vector<size_t> nrAis=GetPU()->GetNrActions();
    Index aI=static_cast<Index>(nrAis[GetIndex()]*
                                  (rand() / (RAND_MAX + 1.0)));
    return(aI);
}